

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool __thiscall
Json::OurReader::parse(OurReader *this,char *beginDoc,char *endDoc,Value *root,bool collectComments)

{
  iterator *piVar1;
  _Elt_pointer ppVVar2;
  bool bVar3;
  bool bVar4;
  Token token;
  undefined1 local_68 [32];
  Token local_48;
  
  bVar3 = (this->features_).allowComments_;
  this->begin_ = beginDoc;
  this->end_ = endDoc;
  this->collectComments_ = (bool)(collectComments & bVar3);
  this->current_ = beginDoc;
  this->lastValueEnd_ = (Location)0x0;
  this->lastValue_ = (Value *)0x0;
  std::__cxx11::string::_M_replace
            ((ulong)&this->commentsBefore_,0,(char *)(this->commentsBefore_)._M_string_length,
             0x125362);
  std::deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>::clear
            (&this->errors_);
  while (ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur,
        ppVVar2 !=
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur) {
    std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
              ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
  }
  local_68._0_8_ = root;
  if (ppVVar2 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<Json::Value*,std::allocator<Json::Value*>>::_M_push_back_aux<Json::Value*>
              ((deque<Json::Value*,std::allocator<Json::Value*>> *)this,(Value **)local_68);
  }
  else {
    *ppVVar2 = root;
    piVar1 = &(this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  this->stackDepth_ = 0;
  bVar3 = readValue(this);
  skipCommentTokens(this,&local_48);
  if ((((this->features_).failIfExtra_ == true) && (local_48.type_ != tokenEndOfStream)) &&
     (local_48.type_ != tokenError)) {
    local_68._0_8_ = local_68 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"Extra non-whitespace after JSON value.","");
    addError(this,(string *)local_68,&local_48,(Location)0x0);
  }
  else {
    if ((this->collectComments_ == true) && ((this->commentsBefore_)._M_string_length != 0)) {
      Value::setComment(root,&this->commentsBefore_,commentAfter);
    }
    if ((this->features_).strictRoot_ != true) {
      return bVar3;
    }
    bVar4 = Value::isArray(root);
    if (bVar4) {
      return bVar3;
    }
    bVar4 = Value::isObject(root);
    if (bVar4) {
      return bVar3;
    }
    local_48.type_ = tokenError;
    local_68._0_8_ = local_68 + 0x10;
    local_48.start_ = beginDoc;
    local_48.end_ = endDoc;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,
               "A valid JSON document must be either an array or an object value.","");
    addError(this,(string *)local_68,&local_48,(Location)0x0);
  }
  if ((Value *)local_68._0_8_ != (Value *)(local_68 + 0x10)) {
    operator_delete((void *)local_68._0_8_);
  }
  return false;
}

Assistant:

bool OurReader::parse(const char* beginDoc,
                   const char* endDoc,
                   Value& root,
                   bool collectComments) {
  if (!features_.allowComments_) {
    collectComments = false;
  }

  begin_ = beginDoc;
  end_ = endDoc;
  collectComments_ = collectComments;
  current_ = begin_;
  lastValueEnd_ = 0;
  lastValue_ = 0;
  commentsBefore_ = "";
  errors_.clear();
  while (!nodes_.empty())
    nodes_.pop();
  nodes_.push(&root);

  stackDepth_ = 0;
  bool successful = readValue();
  Token token;
  skipCommentTokens(token);
  if (features_.failIfExtra_) {
    if (token.type_ != tokenError && token.type_ != tokenEndOfStream) {
      addError("Extra non-whitespace after JSON value.", token);
      return false;
    }
  }
  if (collectComments_ && !commentsBefore_.empty())
    root.setComment(commentsBefore_, commentAfter);
  if (features_.strictRoot_) {
    if (!root.isArray() && !root.isObject()) {
      // Set error location to start of doc, ideally should be first token found
      // in doc
      token.type_ = tokenError;
      token.start_ = beginDoc;
      token.end_ = endDoc;
      addError(
          "A valid JSON document must be either an array or an object value.",
          token);
      return false;
    }
  }
  return successful;
}